

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

ostream * dump_generic_port(ostream *o,string *name,string *doc,string *type)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  char *__s;
  ulong uVar6;
  string args;
  string arg_names;
  char local_e1;
  char *local_e0;
  ulong local_d8;
  char local_d0;
  undefined7 uStack_cf;
  string *local_c0;
  string *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  __s = (type->_M_dataplus)._M_p;
  local_b0[0] = local_a0;
  local_c0 = doc;
  local_b8 = name;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"xyzabcdefghijklmnopqrstuvw","");
  if (*__s == ':') {
    local_e0 = &local_d0;
    local_d8 = 0;
    local_d0 = '\0';
    while( true ) {
      __s = __s + 1;
      if ((*__s == '\0') || (*__s == ':')) break;
      std::__cxx11::string::push_back((char)&local_e0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o," <message_in pattern=\"",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" typetag=\"",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_e0,local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(o,"  <desc>",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</desc>\n",8);
    if (local_d8 != 0) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(o,"  <param_",9);
        local_e1 = local_e0[uVar5];
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,&local_e1,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," symbol=\"",9);
        local_e1 = *(char *)((long)local_b0[0] + uVar5);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_e1,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"/>\n",4);
        bVar2 = uVar6 < local_d8;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o," </message_in>\n",0xf);
    if (*__s == ':') {
      pcVar1 = (local_b8->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + local_b8->_M_string_length);
      pcVar1 = (local_c0->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + local_c0->_M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar4);
      o = dump_generic_port(o,&local_50,&local_70,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
    }
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return o;
}

Assistant:

static ostream &dump_generic_port(ostream &o, string name, string doc, string type)
{
    const char *t = type.c_str();
    string arg_names = "xyzabcdefghijklmnopqrstuvw";

    //start out with argument separator
    if(*t++ != ':')
        return o;
    //now real arguments (assume [] don't exist)
    string args;
    while(*t && *t != ':')
        args += *t++;

    o << " <message_in pattern=\"" << name << "\" typetag=\"" << args << "\">\n";
    o << "  <desc>" << doc << "</desc>\n";

    assert(args.length()<arg_names.length());
    for(unsigned i=0; i<args.length(); ++i)
        o << "  <param_" << args[i] << " symbol=\"" << arg_names[i] << "\"/>\n";
    o << " </message_in>\n";

    if(*t == ':')
        return dump_generic_port(o, name, doc, t);
    else
        return o;
}